

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.c
# Opt level: O0

int xmlThrDefIndentTreeOutput(int v)

{
  int iVar1;
  int ret;
  int v_local;
  
  xmlMutexLock(&xmlThrDefMutex);
  iVar1 = xmlIndentTreeOutputThrDef;
  xmlIndentTreeOutputThrDef = v;
  xmlMutexUnlock(&xmlThrDefMutex);
  return iVar1;
}

Assistant:

int xmlThrDefIndentTreeOutput(int v) {
    int ret;
    xmlMutexLock(&xmlThrDefMutex);
    ret = xmlIndentTreeOutputThrDef;
    xmlIndentTreeOutputThrDef = v;
    xmlMutexUnlock(&xmlThrDefMutex);
    return ret;
}